

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void fasttext::averageRowsFast<512u>
               (Vector *x,vector<int,_std::allocator<int>_> *rows,DenseMatrix *matrix)

{
  undefined8 *puVar1;
  int iVar2;
  float *pfVar3;
  int *piVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  int *piVar14;
  long lVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 in_ZMM0 [64];
  undefined1 in_XMM2 [16];
  Register accum [32];
  undefined8 local_880 [269];
  
  auVar19 = in_ZMM0._0_16_;
  if (((ulong)(x->data_).mem_ & 0x3f) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(x.data()) % sizeof(Register) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0xb3,
                  "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 512U]"
                 );
  }
  pfVar3 = (matrix->data_).mem_;
  if (((ulong)pfVar3 & 0x3f) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(matrix.data()) % sizeof(Register) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/facebookresearch[P]fastText/src/densematrix.cc"
                  ,0xb4,
                  "void fasttext::averageRowsFast(Vector &, const std::vector<int32_t> &, const DenseMatrix &) [Cols = 512U]"
                 );
  }
  piVar4 = (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar5 = (rows->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar4 == piVar5) {
    Vector::zero(x);
    auVar19 = vcvtusi2sd_avx512f(auVar19,(long)(rows->super__Vector_base<int,_std::allocator<int>_>)
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(rows->super__Vector_base<int,_std::allocator<int>_>)
                                               ._M_impl.super__Vector_impl_data._M_start >> 2);
    Vector::mul(x,(float)(1.0 / auVar19._0_8_));
  }
  else {
    lVar13 = (matrix->super_Matrix).n_;
    iVar2 = *piVar4;
    for (lVar15 = 0; piVar14 = piVar4, lVar15 != 0x800; lVar15 = lVar15 + 0x40) {
      puVar1 = (undefined8 *)((long)pfVar3 + lVar15 + iVar2 * lVar13 * 4);
      uVar6 = puVar1[1];
      uVar7 = puVar1[2];
      uVar8 = puVar1[3];
      uVar9 = puVar1[4];
      uVar10 = puVar1[5];
      uVar11 = puVar1[6];
      uVar12 = puVar1[7];
      *(undefined8 *)((long)local_880 + lVar15) = *puVar1;
      *(undefined8 *)((long)local_880 + lVar15 + 8) = uVar6;
      *(undefined8 *)((long)local_880 + lVar15 + 0x10) = uVar7;
      *(undefined8 *)((long)local_880 + lVar15 + 0x18) = uVar8;
      *(undefined8 *)((long)local_880 + lVar15 + 0x20) = uVar9;
      *(undefined8 *)((long)local_880 + lVar15 + 0x28) = uVar10;
      *(undefined8 *)((long)local_880 + lVar15 + 0x30) = uVar11;
      *(undefined8 *)((long)local_880 + lVar15 + 0x38) = uVar12;
    }
    while (piVar14 = piVar14 + 1, piVar14 != piVar5) {
      iVar2 = *piVar14;
      for (lVar15 = 0; lVar15 != 0x800; lVar15 = lVar15 + 0x40) {
        auVar16 = vaddps_avx512f(*(undefined1 (*) [64])((long)local_880 + lVar15),
                                 *(undefined1 (*) [64])((long)pfVar3 + lVar15 + iVar2 * lVar13 * 4))
        ;
        *(undefined1 (*) [64])((long)local_880 + lVar15) = auVar16;
      }
    }
    lVar13 = 0;
    auVar19 = vcvtusi2sd_avx512f(in_XMM2,(long)piVar5 - (long)piVar4 >> 2);
    dVar18 = 1.0 / auVar19._0_8_;
    auVar19._0_4_ = (float)dVar18;
    auVar19._4_4_ = (int)((ulong)dVar18 >> 0x20);
    auVar19._8_8_ = 0;
    auVar16 = vbroadcastss_avx512f(auVar19);
    for (; lVar13 != 0x800; lVar13 = lVar13 + 0x40) {
      auVar17 = vmulps_avx512f(auVar16,*(undefined1 (*) [64])((long)local_880 + lVar13));
      *(undefined1 (*) [64])((long)(x->data_).mem_ + lVar13) = auVar17;
    }
  }
  return;
}

Assistant:

void averageRowsFast(Vector& x, const std::vector<int32_t>& rows, const DenseMatrix &matrix) {
  // Columns must be a multiple of how many floats fit in a register.
  static_assert(Cols % (sizeof(Register) / 4) == 0);
  constexpr unsigned RegisterCount = Cols / (sizeof(Register) / 4);
  // These should be aligned by aligned.h
  assert(reinterpret_cast<uintptr_t>(x.data()) % sizeof(Register) == 0);
  assert(reinterpret_cast<uintptr_t>(matrix.data()) % sizeof(Register) == 0);

  // Guard against empty list of rows with default NaN behavior.
  if (rows.empty()) {
    x.zero();
    x.mul(1.0 / rows.size());
    return;
  }

  // Copy the first row to accumulation registers.
  Register accum[RegisterCount];
  auto row = rows.cbegin();
  const Register *base = reinterpret_cast<const Register*>(matrix.data() + matrix.cols() * *row);
  for (unsigned i = 0; i < RegisterCount; ++i) {
    accum[i] = base[i];
  }
  // Add the rows after the first.
  for (++row; row != rows.cend(); ++row) {
    base = reinterpret_cast<const Register*>(matrix.data() + matrix.cols() * *row);
    for (unsigned i = 0; i < RegisterCount; ++i) {
      accum[i] = Add(accum[i], base[i]);
    }
  }
  // Multiply by (1.0 / rows.size()) and write to x.
  Register mul = Set1(1.0 / rows.size());
  for (unsigned i = 0; i < RegisterCount; ++i) {
    reinterpret_cast<Register*>(x.data())[i] = Multiply(accum[i], mul);
  }
}